

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

CURLcode Curl_add_handle_to_pipeline(Curl_easy *handle,connectdata *conn)

{
  curl_llist_element *pcVar1;
  CURLcode CVar2;
  CURLcode result;
  curl_llist *pipeline;
  curl_llist_element *sendhead;
  connectdata *conn_local;
  Curl_easy *handle_local;
  
  pcVar1 = (conn->send_pipe).head;
  CVar2 = addHandleToPipeline(handle,&conn->send_pipe);
  if ((conn->bundle->multiuse == 1) && (pcVar1 != (conn->send_pipe).head)) {
    Curl_pipeline_leave_write(conn);
    Curl_expire((Curl_easy *)((conn->send_pipe).head)->ptr,0,EXPIRE_RUN_NOW);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_add_handle_to_pipeline(struct Curl_easy *handle,
                                     struct connectdata *conn)
{
  struct curl_llist_element *sendhead = conn->send_pipe.head;
  struct curl_llist *pipeline;
  CURLcode result;

  pipeline = &conn->send_pipe;

  result = addHandleToPipeline(handle, pipeline);
  if((conn->bundle->multiuse == BUNDLE_PIPELINING) &&
     (pipeline == &conn->send_pipe && sendhead != conn->send_pipe.head)) {
    /* this is a new one as head, expire it */
    Curl_pipeline_leave_write(conn); /* not in use yet */
    Curl_expire(conn->send_pipe.head->ptr, 0, EXPIRE_RUN_NOW);
  }

#if 0 /* enable for pipeline debugging */
  print_pipeline(conn);
#endif

  return result;
}